

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O1

size_t __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
::min_buckets_for_size
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
           *this,size_t size)

{
  undefined1 *puVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  if (0.001 <= this->mlf_) {
    auVar8._8_4_ = (int)(size >> 0x20);
    auVar8._0_8_ = size;
    auVar8._12_4_ = 0x45300000;
    dVar7 = floor(((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) /
                  (double)this->mlf_);
    dVar7 = dVar7 + 1.0;
    uVar2 = 0xffffffffffffffff;
    if (dVar7 < 1.8446744073709552e+19) {
      uVar2 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    }
    uVar4 = 0x26;
    puVar1 = prime_list_template<unsigned_long>::value;
    do {
      uVar5 = uVar4 >> 1;
      uVar6 = ~uVar5 + uVar4;
      uVar4 = uVar5;
      if (*(ulong *)((long)puVar1 + uVar5 * 8) < uVar2) {
        puVar1 = (undefined1 *)((ulong *)((long)puVar1 + uVar5 * 8) + 1);
        uVar4 = uVar6;
      }
    } while (0 < (long)uVar4);
    puVar3 = (ulong *)(prime_list_template<unsigned_long>::value + 0x128);
    if (puVar1 != 
        "N5boost4asio6detail14typeid_wrapperINS1_22deadline_timer_serviceINS1_18chrono_time_traitsINSt6chrono3_V212steady_clockENS0_11wait_traitsIS7_EEEEEEEE"
       ) {
      puVar3 = (ulong *)puVar1;
    }
    return *puVar3;
  }
  __assert_fail("mlf_ >= minimum_max_load_factor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/unordered/detail/implementation.hpp"
                ,0xbd3,
                "std::size_t boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>>::min_buckets_for_size(std::size_t) const [Types = boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>]"
               );
}

Assistant:

std::size_t min_buckets_for_size(std::size_t size) const
        {
          BOOST_ASSERT(mlf_ >= minimum_max_load_factor);

          using namespace std;

          // From insert/emplace requirements:
          //
          // size <= mlf_ * count
          // => count >= size / mlf_
          //
          // Or from rehash post-condition:
          //
          // count >= size / mlf_

          return policy::new_bucket_count(
            boost::unordered::detail::double_to_size(
              floor(static_cast<double>(size) / static_cast<double>(mlf_)) +
              1));
        }